

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-common.c
# Opt level: O2

int linktype_to_dlt(int linktype)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (((linktype != 0xf6) && (linktype != 0x102)) && (0xa0 < linktype - 0x68U)) {
    lVar3 = -1;
    do {
      if (lVar3 == 0x13) {
        return linktype;
      }
      lVar1 = lVar3 + 1;
      lVar2 = lVar3 + 1;
      lVar3 = lVar1;
    } while (map[lVar2].linktype != linktype);
    linktype = map[lVar1].dlt;
  }
  return linktype;
}

Assistant:

int
linktype_to_dlt(int linktype)
{
	int i;

	/*
	 * LINKTYPEs in the matching range that *don't*
	 * have the same value as the corresponding DLTs
	 * because, for some reason, not all OSes have the
	 * same value for that DLT.
	 */
	if (linktype == LINKTYPE_PFSYNC)
		return (DLT_PFSYNC);
	if (linktype == LINKTYPE_PKTAP)
		return (DLT_PKTAP);

	/*
	 * For all other values in the matching range, the LINKTYPE
	 * value is the same as the DLT value.
	 */
	if (linktype >= LINKTYPE_MATCHING_MIN &&
	    linktype <= LINKTYPE_MATCHING_MAX)
		return (linktype);

	/*
	 * Map the values outside that range.
	 */
	for (i = 0; map[i].linktype != -1; i++) {
		if (map[i].linktype == linktype)
			return (map[i].dlt);
	}

	/*
	 * If we don't have an entry for this LINKTYPE, return
	 * the link type value; it may be a DLT from an older
	 * version of libpcap.
	 */
	return linktype;
}